

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O1

bool google::ParseCVQualifiers(State *state)

{
  char cVar1;
  char cVar2;
  char cVar3;
  
  cVar1 = *state->mangled_cur;
  if (cVar1 == 'r') {
    state->mangled_cur = state->mangled_cur + 1;
  }
  cVar2 = *state->mangled_cur;
  if (cVar2 == 'V') {
    state->mangled_cur = state->mangled_cur + 1;
  }
  cVar3 = *state->mangled_cur;
  if (cVar3 == 'K') {
    state->mangled_cur = state->mangled_cur + 1;
  }
  return cVar3 == 'K' || (char)((cVar2 == 'V') + (cVar1 == 'r')) != '\0';
}

Assistant:

static bool ParseOneCharToken(State *state, const char one_char_token) {
  if (state->mangled_cur[0] == one_char_token) {
    ++state->mangled_cur;
    return true;
  }
  return false;
}